

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ssize_t __thiscall
kj::VectorOutputStream::write(VectorOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte **params_1;
  uchar *puVar1;
  undefined4 in_register_00000034;
  byte *pbVar2;
  size_t size_local;
  Fault f;
  byte *local_18;
  
  params_1 = &this->fillPos;
  pbVar2 = this->fillPos;
  size_local = (size_t)__buf;
  if ((pbVar2 == (byte *)CONCAT44(in_register_00000034,__fd)) &&
     (local_18 = (this->vector).ptr + (this->vector).size_, pbVar2 != local_18)) {
    local_18 = local_18 + -(long)pbVar2;
    if (local_18 < __buf) {
      _::Debug::Fault::Fault<kj::Exception::Type,unsigned_long&,unsigned_char*&,long>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x130,FAILED,"size <= vector.end() - fillPos",
                 "size, fillPos, vector.end() - fillPos",&size_local,params_1,(long *)&local_18);
      _::Debug::Fault::fatal(&f);
    }
    pbVar2 = pbVar2 + (long)__buf;
  }
  else {
    puVar1 = (this->vector).ptr;
    if (puVar1 + ((this->vector).size_ - (long)pbVar2) < __buf) {
      grow(this,(long)(pbVar2 + (long)__buf) - (long)puVar1);
    }
    local_18 = (byte *)memcpy(*params_1,(byte *)CONCAT44(in_register_00000034,__fd),size_local);
    pbVar2 = *params_1 + size_local;
  }
  *params_1 = pbVar2;
  return (ssize_t)local_18;
}

Assistant:

void VectorOutputStream::write(const void* src, size_t size) {
  if (src == fillPos && fillPos != vector.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= vector.end() - fillPos, size, fillPos, vector.end() - fillPos);
    fillPos += size;
  } else {
    if (vector.end() - fillPos < size) {
      grow(fillPos - vector.begin() + size);
    }

    memcpy(fillPos, src, size);
    fillPos += size;
  }
}